

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formula.cpp
# Opt level: O2

Formula * Kernel::Formula::createLet
                    (uint predicate,VList *variables,Formula *body,Formula *contents)

{
  TermList TVar1;
  TermList body_00;
  TermList bodySort;
  BoolTermFormula *this;
  
  TVar1._content = (uint64_t)Term::createFormula(body);
  body_00._content = (uint64_t)Term::createFormula(contents);
  bodySort = AtomicSort::boolSort();
  TVar1._content = (uint64_t)Term::createLet(predicate,variables,TVar1,body_00,bodySort);
  this = (BoolTermFormula *)BoolTermFormula::operator_new(0x30);
  BoolTermFormula::BoolTermFormula(this,TVar1);
  return &this->super_Formula;
}

Assistant:

Formula* Formula::createLet(unsigned predicate, VList* variables, Formula* body, Formula* contents)
{
  TermList bodyTerm(Term::createFormula(body));
  TermList contentsTerm(Term::createFormula(contents));
  TermList letTerm(Term::createLet(predicate, variables, bodyTerm, contentsTerm, AtomicSort::boolSort()));
  return new BoolTermFormula(letTerm);
}